

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O1

char * __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionVariousTextures::getFragmentShaderCode
          (GeometryShaderLayeredRenderingBoundaryConditionVariousTextures *this)

{
  return 
  "${VERSION}\n\nprecision highp float;\n\nflat in  int  layer_id;\nlayout(location=0) out vec4 color0;\nlayout(location=1) out vec4 color1;\n\nvoid main()\n{\n    vec4 color;\n    switch (layer_id)\n    {\n        case 0:  color = vec4(1, 0, 0, 1); break;\n        case 1:  color = vec4(0, 1, 0, 1); break;\n        case 2:  color = vec4(0, 0, 1, 1); break;\n        case 3:  color = vec4(1, 1, 1, 1); break;\n        default: color = vec4(0, 0, 0, 0); break;\n    }\n    color0 = color;\n    color1 = color;\n}\n"
  ;
}

Assistant:

const char* GeometryShaderLayeredRenderingBoundaryConditionVariousTextures::getFragmentShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"flat in  int  layer_id;\n"
								"layout(location=0) out vec4 color0;\n"
								"layout(location=1) out vec4 color1;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    vec4 color;\n"
								"    switch (layer_id)\n"
								"    {\n"
								"        case 0:  color = vec4(1, 0, 0, 1); break;\n"
								"        case 1:  color = vec4(0, 1, 0, 1); break;\n"
								"        case 2:  color = vec4(0, 0, 1, 1); break;\n"
								"        case 3:  color = vec4(1, 1, 1, 1); break;\n"
								"        default: color = vec4(0, 0, 0, 0); break;\n"
								"    }\n"
								"    color0 = color;\n"
								"    color1 = color;\n"
								"}\n";
	return result;
}